

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O3

raplcap_msr_sys_ctx * msr_sys_init(uint32_t *n_pkg,uint32_t *n_die)

{
  msr_topology *pmVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  uint32_t ncpus;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  msr_topology *topo;
  raplcap_msr_sys_ctx *ctx;
  ulong __nmemb;
  uint32_t *puVar9;
  int *piVar10;
  char *pcVar11;
  int *piVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  char local_58 [40];
  
  if (n_pkg == (uint32_t *)0x0) {
    __assert_fail("n_pkg",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                  ,0xdf,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
  }
  if (n_die != (uint32_t *)0x0) {
    ncpus = get_cpu_count();
    if (ncpus == 0) {
      msr_sys_init_cold_6();
    }
    else {
      uVar18 = (ulong)ncpus;
      topo = (msr_topology *)malloc(uVar18 * 0xc);
      if (topo == (msr_topology *)0x0) {
        msr_sys_init_cold_5();
      }
      else {
        iVar4 = get_topology(topo,ncpus);
        if (iVar4 == 0) {
          qsort(topo,uVar18,0xc,cmp_msr_topology_pkg_die);
          ctx = (raplcap_msr_sys_ctx *)malloc(0x18);
          if (ctx == (raplcap_msr_sys_ctx *)0x0) {
            msr_sys_init_cold_4();
          }
          else {
            uVar13 = topo[ncpus - 1].pkg + 1;
            ctx->n_pkg = uVar13;
            uVar5 = topo[ncpus - 1].die + 1;
            ctx->n_die = uVar5;
            uVar6 = 1;
            if (ncpus != 1) {
              puVar9 = &topo[1].die;
              lVar17 = uVar18 - 1;
              uVar14 = topo->pkg;
              do {
                pmVar1 = (msr_topology *)(puVar9 + -1);
                uVar7 = 1;
                if (pmVar1->pkg == uVar14) {
                  uVar7 = (uint)(*puVar9 != puVar9[-3]);
                }
                uVar6 = uVar6 + uVar7;
                puVar9 = puVar9 + 3;
                lVar17 = lVar17 + -1;
                uVar14 = pmVar1->pkg;
              } while (lVar17 != 0);
            }
            ctx->n_fds = uVar6;
            __nmemb = (ulong)uVar6;
            puVar9 = (uint32_t *)malloc(__nmemb * 4);
            if (puVar9 == (uint32_t *)0x0) {
              msr_sys_init_cold_3();
            }
            else {
              *puVar9 = topo->cpu;
              uVar7 = 1;
              if (ncpus != 1) {
                sVar15 = 0xc;
                do {
                  uVar2 = *(uint *)((long)&topo->pkg + sVar15);
                  uVar3 = *(uint *)((long)&topo[-1].pkg + sVar15);
                  iVar4 = -(uint)(uVar2 < uVar3);
                  if (uVar3 < uVar2) {
                    iVar4 = 1;
                  }
                  if (((iVar4 == 0) &&
                      (uVar2 = *(uint *)((long)&topo->die + sVar15),
                      uVar3 = *(uint *)((long)topo + (sVar15 - 8)), iVar4 = -(uint)(uVar2 < uVar3),
                      uVar3 < uVar2)) || (iVar4 != 0)) {
                    uVar16 = (ulong)uVar7;
                    uVar7 = uVar7 + 1;
                    puVar9[uVar16] = *(uint32_t *)((long)&topo->cpu + sVar15);
                  }
                  sVar15 = sVar15 + 0xc;
                } while (uVar18 * 0xc != sVar15);
              }
              if (uVar7 != uVar6) {
                __assert_fail("j == n_cpus_to_open",
                              "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                              ,0xa6,
                              "void get_cpus_to_open(uint32_t *, uint32_t, const msr_topology *, uint32_t)"
                             );
              }
              piVar10 = (int *)calloc(__nmemb,4);
              ctx->fds = piVar10;
              if (piVar10 != (int *)0x0) {
                pcVar11 = getenv("RAPLCAP_READ_ONLY");
                if (pcVar11 == (char *)0x0) {
                  iVar4 = 2;
                }
                else {
                  iVar4 = atoi(pcVar11);
                  iVar4 = (uint)(iVar4 == 0) * 2;
                }
                if (__nmemb != 0) {
                  uVar18 = 0;
                  do {
                    uVar6 = puVar9[uVar18];
                    snprintf(local_58,0x20,"/dev/cpu/%u/msr_safe",(ulong)uVar6);
                    iVar8 = open(local_58,iVar4);
                    if (iVar8 < 0) {
                      snprintf(local_58,0x20,"/dev/cpu/%u/msr",(ulong)uVar6);
                      iVar8 = open(local_58,iVar4);
                      if (iVar8 < 0) {
                        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
                        __stream = _stderr;
                        piVar12 = __errno_location();
                        pcVar11 = strerror(*piVar12);
                        fprintf(__stream,"%s: %s\n",local_58,pcVar11);
                        if (*piVar12 == 2) {
                          msr_sys_init_cold_1();
                        }
                        piVar10[uVar18] = iVar8;
                        iVar4 = *piVar12;
                        free(puVar9);
                        msr_sys_destroy(ctx);
                        free(topo);
                        *piVar12 = iVar4;
                        return (raplcap_msr_sys_ctx *)0x0;
                      }
                    }
                    piVar10[uVar18] = iVar8;
                    uVar18 = uVar18 + 1;
                  } while (__nmemb != uVar18);
                }
                free(puVar9);
                free(topo);
                *n_pkg = uVar13;
                *n_die = uVar5;
                return ctx;
              }
              msr_sys_init_cold_2();
            }
          }
        }
        else {
          free(topo);
        }
      }
    }
    return (raplcap_msr_sys_ctx *)0x0;
  }
  __assert_fail("n_die",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-sys-linux.c"
                ,0xe0,"raplcap_msr_sys_ctx *msr_sys_init(uint32_t *, uint32_t *)");
}

Assistant:

raplcap_msr_sys_ctx* msr_sys_init(uint32_t* n_pkg, uint32_t* n_die) {
  msr_topology* topo;
  raplcap_msr_sys_ctx* ctx;
  uint32_t* cpus_to_open;
  uint32_t ncpus;
  int err_save;
  assert(n_pkg);
  assert(n_die);
  // need to decide which CPU MSRs to open to cover all RAPL zones
  if ((ncpus = get_cpu_count()) == 0) {
    raplcap_perror(ERROR, "msr_sys_init: get_cpu_count");
    return NULL;
  }
  if ((topo = malloc(ncpus * sizeof(*topo))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    return NULL;
  }
  // get topology for all CPUs, sort by pkg and die, then count unique combinations to determine how many MSRs to open
  if (get_topology(topo, ncpus)) {
    free(topo);
    return NULL;
  }
  qsort(topo, ncpus, sizeof(*topo), cmp_msr_topology_pkg_die);
  if ((ctx = malloc(sizeof(*ctx))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(topo);
    return NULL;
  }
  // assumes homogeneous die configurations across packages
  ctx->n_pkg = topo[ncpus - 1].pkg + 1;
  ctx->n_die = topo[ncpus - 1].die + 1;
  ctx->n_fds = count_unique_pkg_die(topo, ncpus);
  raplcap_log(DEBUG, "msr_sys_init: n_cpus=%"PRIu32", n_pkg=%"PRIu32", n_die=%"PRIu32", n_fds=%"PRIu32"\n",
              ncpus, ctx->n_pkg, ctx->n_die, ctx->n_fds);
  // now determine which CPUs to open MSRs for and do it
  if ((cpus_to_open = malloc(ctx->n_fds * sizeof(uint32_t))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: malloc");
    free(ctx);
    free(topo);
    return NULL;
  }
  get_cpus_to_open(cpus_to_open, ctx->n_fds, topo, ncpus);
  if ((ctx->fds = calloc(ctx->n_fds, sizeof(int))) == NULL) {
    raplcap_perror(ERROR, "msr_sys_init: calloc");
    free(cpus_to_open);
    free(ctx);
    free(topo);
    return NULL;
  }
  if (open_msrs(ctx->fds, cpus_to_open, ctx->n_fds)) {
    err_save = errno;
    free(cpus_to_open);
    msr_sys_destroy(ctx);
    free(topo);
    errno = err_save;
    return NULL;
  }
  free(cpus_to_open);
  free(topo);
  *n_pkg = ctx->n_pkg;
  *n_die = ctx->n_die;
  return ctx;
}